

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckObject(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  ctmbstr local_38;
  ctmbstr word;
  AttVal *av;
  Node *tnode;
  Bool HasDescription;
  Bool HasAlt;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  bVar2 = false;
  BVar3 = Level1_Enabled(doc);
  if (BVar3 != no) {
    if (node->content != (Node *)0x0) {
      if (node->content->type != TextNode) {
        for (word = (ctmbstr)node->content->attributes; word != (ctmbstr)0x0;
            word = *(ctmbstr *)word) {
          if (((word != (ctmbstr)0x0) && (*(long *)(word + 8) != 0)) && (**(int **)(word + 8) == 10)
             ) {
            bVar1 = true;
            break;
          }
        }
      }
      if (!bVar1) {
        local_38 = (ctmbstr)0x0;
        BVar3 = prvTidynodeIsText(node->content);
        if (BVar3 != no) {
          local_38 = textFromOneNode(doc,node->content);
        }
        if ((local_38 == (ctmbstr)0x0) &&
           (BVar3 = prvTidynodeIsText(node->content->content), BVar3 != no)) {
          local_38 = textFromOneNode(doc,node->content->content);
        }
        if ((local_38 != (ctmbstr)0x0) && (BVar3 = IsWhitespace(local_38), BVar3 == no)) {
          bVar2 = true;
        }
      }
    }
    if ((!bVar1) && (!bVar2)) {
      prvTidyReportAccessError(doc,node,0x29e);
    }
  }
  return;
}

Assistant:

static void CheckObject( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    if (Level1_Enabled( doc ))
    {
        if ( node->content != NULL)
        {
            if ( node->content->type != TextNode )
            {
                Node* tnode = node->content;
                AttVal* av;

                for ( av=tnode->attributes; av; av = av->next )
                {
                    if ( attrIsALT(av) )
                    {
                        HasAlt = yes;
                        break;
                    }
                }
            }

            /* Must have alternate text representation for that element */
            if ( !HasAlt )
            {
                ctmbstr word = NULL;

                if ( TY_(nodeIsText)(node->content) )
                    word = textFromOneNode( doc, node->content );

                if ( word == NULL &&
                     TY_(nodeIsText)(node->content->content) )
                {
                    word = textFromOneNode( doc, node->content->content );
                }
                    
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasAlt && !HasDescription )
        {
            TY_(ReportAccessError)( doc, node, OBJECT_MISSING_ALT );
        }
    }
}